

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::DrawTestBase::prepareTextureD32F(DrawTestBase *this,texture *texture)

{
  long lVar1;
  GLfloat data [16384];
  undefined8 auStack_10008 [8192];
  
  lVar1 = 0;
  do {
    *(undefined8 *)((long)auStack_10008 + lVar1 * 4) = 0xbf800000bf800000;
    *(undefined8 *)((long)auStack_10008 + lVar1 * 4 + 8) = 0xbf800000bf800000;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x4000);
  Utils::texture::create(texture,0x80,0x80,0x8cac);
  Utils::texture::update(texture,0x80,0x80,0,0x1902,0x1406,auStack_10008);
  return;
}

Assistant:

void DrawTestBase::prepareTextureD32F(Utils::texture& texture)
{
	static const GLuint size = m_width * m_height;
	GLfloat				data[size];

	for (GLuint i = 0; i < size; ++i)
	{
		data[i] = -1.0f;
	}

	texture.create(m_width, m_height, GL_DEPTH_COMPONENT32F);
	texture.update(m_width, m_height, 0 /* depth */, GL_DEPTH_COMPONENT, GL_FLOAT, data);
}